

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCacheManager.cxx
# Opt level: O1

void cmCacheManager::OutputValueNoNewlines(ostream *fout,string *value)

{
  char cVar1;
  size_type sVar2;
  ostream *poVar3;
  char local_12;
  char local_11;
  
  sVar2 = value->_M_string_length;
  if ((sVar2 != 0) &&
     ((cVar1 = (value->_M_dataplus)._M_p[sVar2 - 1], cVar1 == ' ' || (cVar1 == '\t')))) {
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>(fout,&local_12,1);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,(value->_M_dataplus)._M_p,value->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_11,1);
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>(fout,(value->_M_dataplus)._M_p,sVar2);
  return;
}

Assistant:

void cmCacheManager::OutputValueNoNewlines(std::ostream& fout,
                                           std::string const& value)
{
  // if value has trailing space or tab, enclose it in single quotes
  if (!value.empty() && (value.back() == ' ' || value.back() == '\t')) {
    fout << '\'' << value << '\'';
  } else {
    fout << value;
  }
}